

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O0

bool __thiscall QNetworkCookie::operator==(QNetworkCookie *this,QNetworkCookie *other)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  QNetworkCookiePrivate *pQVar5;
  long in_FS_OFFSET;
  QDateTime *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  SameSite SVar6;
  QByteArray *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  bool local_41;
  bool local_19;
  QDateTime local_18 [8];
  QDateTime local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::operator==((QSharedDataPointer<QNetworkCookiePrivate> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (QSharedDataPointer<QNetworkCookiePrivate> *)in_stack_ffffffffffffff78);
  if (bVar2) {
    local_19 = true;
  }
  else {
    QSharedDataPointer<QNetworkCookiePrivate>::operator->
              ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1c24);
    QSharedDataPointer<QNetworkCookiePrivate>::operator->
              ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1c37);
    bVar3 = ::operator==((QByteArray *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                         ,in_stack_ffffffffffffff88);
    bVar1 = false;
    bVar2 = false;
    local_41 = false;
    if (bVar3) {
      QSharedDataPointer<QNetworkCookiePrivate>::operator->
                ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1c6e);
      QSharedDataPointer<QNetworkCookiePrivate>::operator->
                ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1c81);
      bVar3 = ::operator==((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
      local_41 = false;
      if (bVar3) {
        QSharedDataPointer<QNetworkCookiePrivate>::operator->
                  ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1cae);
        QDateTime::toUTC();
        bVar1 = true;
        QSharedDataPointer<QNetworkCookiePrivate>::operator->
                  ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1cce);
        QDateTime::toUTC();
        bVar2 = true;
        bVar3 = ::operator==((QDateTime *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff78);
        local_41 = false;
        if (bVar3) {
          QSharedDataPointer<QNetworkCookiePrivate>::operator->
                    ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1d0f);
          QSharedDataPointer<QNetworkCookiePrivate>::operator->
                    ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1d22);
          bVar3 = ::operator==((QString *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               (QString *)in_stack_ffffffffffffff78);
          local_41 = false;
          if (bVar3) {
            QSharedDataPointer<QNetworkCookiePrivate>::operator->
                      ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1d4f);
            QSharedDataPointer<QNetworkCookiePrivate>::operator->
                      ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1d62);
            bVar3 = ::operator==((QString *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                 (QString *)in_stack_ffffffffffffff78);
            local_41 = false;
            if (bVar3) {
              pQVar5 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                                 ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1d8f);
              uVar4 = (uint)(pQVar5->secure & 1);
              pQVar5 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                                 ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1da8);
              local_41 = false;
              if (uVar4 == (pQVar5->secure & 1)) {
                QSharedDataPointer<QNetworkCookiePrivate>::operator->
                          ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1dcb);
                QSharedDataPointer<QNetworkCookiePrivate>::operator->
                          ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1dde);
                bVar3 = ::operator==((QString *)
                                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                     (QString *)in_stack_ffffffffffffff78);
                local_41 = false;
                if (bVar3) {
                  pQVar5 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                                     ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1e08);
                  SVar6 = pQVar5->sameSite;
                  pQVar5 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                                     ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b1e1c);
                  local_41 = SVar6 == pQVar5->sameSite;
                }
              }
            }
          }
        }
      }
    }
    local_19 = local_41;
    if (bVar2) {
      QDateTime::~QDateTime(local_18);
    }
    if (bVar1) {
      QDateTime::~QDateTime(local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool QNetworkCookie::operator==(const QNetworkCookie &other) const
{
    if (d == other.d)
        return true;
    return d->name == other.d->name &&
        d->value == other.d->value &&
        d->expirationDate.toUTC() == other.d->expirationDate.toUTC() &&
        d->domain == other.d->domain &&
        d->path == other.d->path &&
        d->secure == other.d->secure &&
        d->comment == other.d->comment &&
        d->sameSite == other.d->sameSite;
}